

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O0

int __thiscall QButtonGroup::id(QButtonGroup *this,QAbstractButton *button)

{
  long lVar1;
  int iVar2;
  QButtonGroupPrivate *this_00;
  long in_FS_OFFSET;
  QButtonGroupPrivate *d;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QButtonGroup *)0x5104ba);
  iVar2 = QHash<QAbstractButton_*,_int>::value
                    ((QHash<QAbstractButton_*,_int> *)this_00,
                     (QAbstractButton **)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::id(QAbstractButton *button) const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(button, -1);
}